

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O3

Term * Kernel::SubstHelper::
       applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                 (Term *trm,DerefApplicator *applicator,bool noSharing)

{
  TermList ***pppTVar1;
  Term ***pppTVar2;
  uint uVar3;
  TermList **ppTVar4;
  Self SVar5;
  Self SVar6;
  size_t sVar7;
  Self SVar8;
  uint uVar9;
  int iVar10;
  Term *pTVar11;
  TermList TVar12;
  Entry *pEVar13;
  Term *pTVar14;
  TermList *pTVar15;
  Term **ppTVar16;
  bool *pbVar17;
  TermList **ppTVar18;
  Formula *formula;
  long lVar19;
  Literal *lit;
  ulong uVar20;
  Stack<Kernel::TermList_*> *pSVar21;
  _Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false> this;
  ulong uVar22;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> args;
  Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> modified;
  Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> toDo;
  Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> terms;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_80;
  Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_70;
  DArray<Kernel::TermList> local_60;
  Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_48;
  TermList local_38;
  
  uVar9 = trm->_functor;
  if (0xfffffff8 < uVar9) {
    uVar3 = (&switchD_003272f7::switchdataD_008d4f70)[~uVar9];
    switch(uVar9) {
    case 0xfffffffa:
      Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_80);
      Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
                (&local_70);
      Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_48);
      Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&local_60);
      _Unwind_Resume((long)&switchD_003272f7::switchdataD_008d4f70 + (long)(int)uVar3);
    case 0xfffffffb:
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                ((TermList)*(uint64_t *)&trm[-1]._maxRedLen,applicator,noSharing);
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                ((TermList)trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                 noSharing);
      pTVar14 = (Term *)(*(code *)(&DAT_008d4fa8 +
                                  *(int *)(&DAT_008d4fa8 + (ulong)~trm->_functor * 4)))();
      return pTVar14;
    case 0xfffffffc:
      pTVar14 = applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                          (*(Term **)&trm[-1]._functor,applicator,noSharing);
      pTVar14 = Term::createTuple(pTVar14);
      return pTVar14;
    case 0xfffffffd:
      formula = applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                          (*(Formula **)&trm[-1]._functor,applicator,noSharing);
      pTVar14 = Term::createFormula(formula);
      return pTVar14;
    case 0xfffffffe:
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                ((TermList)*(uint64_t *)&trm[-1]._maxRedLen,applicator,noSharing);
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                ((TermList)trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                 noSharing);
      pTVar14 = (Term *)(*(code *)(&DAT_008d4fc4 +
                                  *(int *)(&DAT_008d4fc4 + (ulong)~trm->_functor * 4)))();
      return pTVar14;
    case 0xffffffff:
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                (*(Formula **)&trm[-1]._functor,applicator,noSharing);
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                ((TermList)trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                 noSharing);
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                ((TermList)trm->_args[(ulong)(*(uint *)&trm->field_0xc & 0xfffffff) - 1]._content,
                 applicator,noSharing);
      pTVar14 = (Term *)(*(code *)(&DAT_008d4fe0 +
                                  *(int *)(&DAT_008d4fe0 + (ulong)~trm->_functor * 4)))();
      return pTVar14;
    }
    Lib::DArray<Kernel::TermList>::DArray(&local_60,(ulong)(*(uint *)&trm->field_0xc & 0xfffffff));
    uVar9 = *(uint *)&trm->field_0xc & 0xfffffff;
    uVar20 = (ulong)uVar9;
    if (uVar9 != 0) {
      lVar19 = 0;
      uVar22 = 0;
      do {
        TVar12 = applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                           (trm->_args[uVar20 + lVar19]._content,applicator,noSharing);
        local_60._array[uVar22]._content = TVar12._content;
        uVar22 = uVar22 + 1;
        uVar20 = (ulong)(*(uint *)&trm->field_0xc & 0xfffffff);
        lVar19 = lVar19 + -1;
      } while (uVar22 < uVar20);
    }
    pTVar14 = (Term *)(*(code *)(&DAT_008d4f8c + *(int *)(&DAT_008d4f8c + (ulong)~trm->_functor * 4)
                                ))();
    return pTVar14;
  }
  Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           &local_60);
  Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&local_48);
  Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled(&local_70);
  Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&local_80);
  SVar6._M_t.super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
  super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl =
       local_70._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
       super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl;
  pbVar17 = *(bool **)((long)local_70._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                             .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10);
  if (pbVar17 ==
      *(bool **)((long)local_70._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                       .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x18)) {
    Lib::Stack<bool>::expand
              ((Stack<bool> *)
               local_70._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t
               .super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
               super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl);
    pbVar17 = *(bool **)((long)SVar6._M_t.
                               super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                               .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10
                        );
  }
  pSVar21 = (Stack<Kernel::TermList_*> *)local_60._size;
  *pbVar17 = false;
  *(bool **)((long)SVar6._M_t.
                   super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                   .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
       pbVar17 + 1;
  uVar9 = *(uint *)&trm->field_0xc;
  ppTVar18 = *(TermList ***)(local_60._size + 0x10);
  if (ppTVar18 == *(TermList ***)(local_60._size + 0x18)) {
    Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_60._size);
    ppTVar18 = *(TermList ***)((long)pSVar21 + 0x10);
  }
  pTVar15 = trm->_args + (uVar9 & 0xfffffff);
LAB_003273e9:
  *ppTVar18 = pTVar15;
  pSVar21->_cursor = pSVar21->_cursor + 1;
LAB_003273f2:
  sVar7 = local_60._size;
  this._M_head_impl = (Stack<Kernel::TermList> *)local_80._self;
  ppTVar4 = *(TermList ***)(local_60._size + 0x10);
  ppTVar18 = ppTVar4 + -1;
  *(TermList ***)(local_60._size + 0x10) = ppTVar18;
  pTVar15 = ppTVar4[-1];
  pTVar14 = (Term *)pTVar15->_content;
  if (((uint)pTVar14 & 3) == 2) {
    ppTVar16 = *(Term ***)
                ((long)local_48._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl +
                0x10);
    if (ppTVar16 !=
        *(Term ***)
         ((long)local_48._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 8)) {
      *(Term ***)
       ((long)local_48._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x10) =
           ppTVar16 + -1;
      pTVar14 = ppTVar16[-1];
      pbVar17 = *(bool **)((long)local_70._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                                 .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl +
                          0x10);
      *(bool **)((long)local_70._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                       .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
           pbVar17 + -1;
      if (pbVar17[-1] == false) {
        pTVar15 = *(TermList **)
                   ((long)local_80._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl
                   + 8) + (((ulong)((long)*(TermList **)
                                           ((long)local_80._self._M_t.
                                                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                                  .
                                                  super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                                  ._M_head_impl + 0x10) -
                                   (long)*(TermList **)
                                          ((long)local_80._self._M_t.
                                                 super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                                 .
                                                 super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                                 ._M_head_impl + 8)) >> 3) -
                          (ulong)(*(uint *)&pTVar14->field_0xc & 0xfffffff));
        *(TermList **)
         ((long)local_80._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
             pTVar15;
        if (pTVar15 ==
            *(TermList **)
             ((long)local_80._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
             0x18)) {
          Lib::Stack<Kernel::TermList>::expand
                    ((Stack<Kernel::TermList> *)
                     local_80._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
          goto LAB_003276d7;
        }
        goto LAB_003276dc;
      }
      uVar9 = *(uint *)&pTVar14->field_0xc & 0xfffffff;
      pTVar15 = *(TermList **)
                 ((long)local_80._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
                 0x10) + (-1 - (ulong)(uVar9 - 1));
      if (noSharing) {
LAB_0032747c:
        pTVar11 = Term::createNonShared(pTVar14,pTVar15);
      }
      else {
        if (uVar9 != 0) {
          lVar19 = 0;
          do {
            uVar20 = pTVar15[lVar19]._content & 3;
            if (uVar20 == 0) {
              if ((*(byte *)(pTVar15[lVar19]._content + 0x28) & 8) == 0) goto LAB_0032747c;
            }
            else if ((int)uVar20 == 3) goto LAB_0032747c;
            lVar19 = lVar19 + 1;
          } while (uVar9 != (uint)lVar19);
        }
        if ((pTVar14->_args[0]._content & 0x20) == 0) {
          pTVar11 = Term::create(pTVar14,pTVar15);
        }
        else {
          pTVar11 = &AtomicSort::create((AtomicSort *)pTVar14,pTVar15)->super_Term;
        }
      }
      SVar5._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
           local_80._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl;
      pTVar15 = *(TermList **)
                 ((long)local_80._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
                 8) + (((ulong)((long)*(TermList **)
                                       ((long)local_80._self._M_t.
                                              super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                              .
                                              super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                              ._M_head_impl + 0x10) -
                               (long)*(TermList **)
                                      ((long)local_80._self._M_t.
                                             super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                             .
                                             super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                             ._M_head_impl + 8)) >> 3) -
                      (ulong)(*(uint *)&pTVar14->field_0xc & 0xfffffff));
      *(TermList **)
       ((long)local_80._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
           pTVar15;
      if (pTVar15 ==
          *(TermList **)
           ((long)local_80._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x18)
         ) {
        Lib::Stack<Kernel::TermList>::expand
                  ((Stack<Kernel::TermList> *)
                   local_80._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
        pTVar15 = *(TermList **)
                   ((long)SVar5._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl
                   + 0x10);
      }
      pTVar15->_content = (uint64_t)pTVar11;
      *(TermList **)
       ((long)SVar5._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
           pTVar15 + 1;
      goto LAB_0032765a;
    }
    pbVar17 = *(bool **)((long)local_70._self._M_t.
                               super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                               .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10
                        );
    *(bool **)((long)local_70._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                     .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
         pbVar17 + -1;
    if (pbVar17[-1] != true) goto LAB_003279a7;
    uVar9 = *(uint *)&trm->field_0xc & 0xfffffff;
    pTVar15 = *(TermList **)
               ((long)local_80._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
               0x10) + (-1 - (ulong)(uVar9 - 1));
    uVar20 = trm->_args[0]._content;
    if ((uVar20 & 0x10) != 0) {
      trm = &Literal::create((Literal *)trm,pTVar15)->super_Term;
      goto LAB_003279a7;
    }
    if ((uVar20 & 0x20) != 0) {
      trm = &AtomicSort::create((AtomicSort *)trm,pTVar15)->super_Term;
      goto LAB_003279a7;
    }
    if (noSharing) goto LAB_003277d6;
    if (uVar9 == 0) goto LAB_0032799c;
    lVar19 = 0;
    goto LAB_00327974;
  }
  if (ppTVar18 == *(TermList ***)(local_60._size + 0x18)) {
    Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_60._size);
    ppTVar18 = *(TermList ***)(sVar7 + 0x10);
    pTVar14 = (Term *)pTVar15->_content;
  }
  SVar8._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
  .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl =
       local_48._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
       .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl;
  this._M_head_impl =
       (Stack<Kernel::TermList> *)
       local_80._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
       .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl;
  *ppTVar18 = pTVar15 + -1;
  pppTVar1 = (TermList ***)(sVar7 + 0x10);
  *pppTVar1 = *pppTVar1 + 1;
  uVar9 = (uint)pTVar14 & 3;
  if (uVar9 == 3) {
    local_38._content = (uint64_t)((uint)pTVar14 | 3);
    pEVar13 = Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
              findEntry(&applicator->im->_derefBindings,&local_38);
    SVar5._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
            )local_80._self;
    TVar12._content = (pEVar13->_val)._content;
    pTVar15 = *(TermList **)
               ((long)local_80._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
               0x10);
    if (pTVar15 ==
        *(TermList **)
         ((long)local_80._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x18))
    {
      Lib::Stack<Kernel::TermList>::expand
                ((Stack<Kernel::TermList> *)
                 local_80._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
      pTVar15 = *(TermList **)
                 ((long)SVar5._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
                 0x10);
    }
    pTVar15->_content = TVar12._content;
    *(TermList **)
     ((long)SVar5._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
         pTVar15 + 1;
joined_r0x00327595:
    if ((Term *)TVar12._content != pTVar14) {
LAB_0032765a:
      (*(bool **)((long)local_70._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                        .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10))[-1]
           = true;
    }
    goto LAB_003273f2;
  }
  if (uVar9 == 1) {
    TVar12 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::
             DerefApplicator::apply(applicator,(uint)((ulong)pTVar14 >> 2));
    SVar5._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
            )local_80._self;
    pTVar15 = *(TermList **)
               ((long)local_80._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
               0x10);
    if (pTVar15 ==
        *(TermList **)
         ((long)local_80._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x18))
    {
      Lib::Stack<Kernel::TermList>::expand
                ((Stack<Kernel::TermList> *)
                 local_80._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
      pTVar15 = *(TermList **)
                 ((long)SVar5._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
                 0x10);
    }
    pTVar15->_content = TVar12._content;
    *(TermList **)
     ((long)SVar5._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
         pTVar15 + 1;
    goto joined_r0x00327595;
  }
  if (((ulong)pTVar14 & 1) == 0) {
    if ((pTVar14->_args[0]._content & 8) != 0) {
      pTVar11 = pTVar14;
      if (*(int *)&pTVar14->field_0xc < 0) {
        iVar10 = 0;
        do {
          pTVar11 = *(Term **)&(pTVar11->field_9)._vars;
          if (((ulong)pTVar11 & 1) != 0) {
            uVar9 = 3;
            goto LAB_00327686;
          }
          iVar10 = iVar10 + 2;
        } while (*(int *)&pTVar11->field_0xc < 0);
      }
      else {
        iVar10 = 0;
      }
      uVar9 = (pTVar11->field_9)._vars;
LAB_00327686:
      if (iVar10 + uVar9 == 0) goto LAB_0032768a;
    }
    if (pTVar14->_functor < 0xfffffff9) goto LAB_003276f4;
    pTVar14 = applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefApplicator>
                        (pTVar14,applicator,noSharing);
    pTVar15 = *(TermList **)((long)this._M_head_impl + 0x10);
    if (pTVar15 == *(TermList **)((long)this._M_head_impl + 0x18)) {
      Lib::Stack<Kernel::TermList>::expand(this._M_head_impl);
LAB_003276d7:
      pTVar15 = (this._M_head_impl)->_cursor;
    }
  }
  else {
LAB_0032768a:
    pTVar15 = *(TermList **)
               ((long)local_80._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
               0x10);
    if (pTVar15 ==
        *(TermList **)
         ((long)local_80._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x18))
    {
      Lib::Stack<Kernel::TermList>::expand
                ((Stack<Kernel::TermList> *)
                 local_80._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
      goto LAB_003276d7;
    }
  }
LAB_003276dc:
  pTVar15->_content = (uint64_t)pTVar14;
  (this._M_head_impl)->_cursor = pTVar15 + 1;
  goto LAB_003273f2;
LAB_003277d6:
  trm = Term::createNonShared(trm,pTVar15);
  goto LAB_003279a7;
LAB_003276f4:
  ppTVar16 = *(Term ***)
              ((long)local_48._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x10
              );
  if (ppTVar16 ==
      *(Term ***)
       ((long)local_48._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x18)) {
    Lib::Stack<Kernel::Term_*>::expand
              ((Stack<Kernel::Term_*> *)
               local_48._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl);
    ppTVar16 = *(Term ***)
                ((long)SVar8._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl +
                0x10);
  }
  SVar6._M_t.super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
  super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl =
       (__uniq_ptr_data<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>,_true,_true>)
       (__uniq_ptr_data<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>,_true,_true>)
       local_70._self;
  *ppTVar16 = pTVar14;
  pppTVar2 = (Term ***)
             ((long)SVar8._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x10)
  ;
  *pppTVar2 = *pppTVar2 + 1;
  pbVar17 = *(bool **)((long)local_70._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                             .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10);
  if (pbVar17 ==
      *(bool **)((long)local_70._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                       .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x18)) {
    Lib::Stack<bool>::expand
              ((Stack<bool> *)
               local_70._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t
               .super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
               super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl);
    pbVar17 = *(bool **)((long)SVar6._M_t.
                               super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                               .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10
                        );
  }
  pSVar21 = (Stack<Kernel::TermList_*> *)local_60._size;
  *pbVar17 = false;
  *(bool **)((long)SVar6._M_t.
                   super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                   .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
       pbVar17 + 1;
  uVar9 = *(uint *)&pTVar14->field_0xc;
  ppTVar18 = *(TermList ***)(local_60._size + 0x10);
  if (ppTVar18 == *(TermList ***)(local_60._size + 0x18)) {
    Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_60._size);
    ppTVar18 = *(TermList ***)((long)pSVar21 + 0x10);
  }
  pTVar15 = pTVar14->_args + (uVar9 & 0xfffffff);
  goto LAB_003273e9;
  while (lVar19 = lVar19 + 1, uVar9 != (uint)lVar19) {
LAB_00327974:
    uVar20 = pTVar15[lVar19]._content & 3;
    if (uVar20 == 0) {
      if ((*(byte *)(pTVar15[lVar19]._content + 0x28) & 8) == 0) goto LAB_003277d6;
    }
    else if ((int)uVar20 == 3) goto LAB_003277d6;
  }
LAB_0032799c:
  trm = Term::create(trm,pTVar15);
LAB_003279a7:
  Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_80);
  Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled(&local_70)
  ;
  Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
            (&local_48);
  Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
            )&local_60);
  return trm;
}

Assistant:

Term* SubstHelper::applyImpl(Term* trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm->isSpecial()) {
    Term::SpecialTermData* sd = trm->getSpecialData();
    switch(trm->specialFunctor()) {
    case SpecialFunctor::ITE:
      return Term::createITE(
    applyImpl<ProcessSpecVars>(sd->getCondition(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(1), applicator, noSharing),
    applyImpl<ProcessSpecVars>(sd->getSort(), applicator, noSharing)
    );
    case SpecialFunctor::LET:
      return Term::createLet(
    sd->getFunctor(),
    sd->getVariables(),
    applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    sd->getSort()
    );
    case SpecialFunctor::FORMULA:
      return Term::createFormula(
      applyImpl<ProcessSpecVars>(sd->getFormula(), applicator, noSharing)
      );
    case SpecialFunctor::LET_TUPLE:
      return Term::createTupleLet(
        sd->getFunctor(),
        sd->getTupleSymbols(),
        applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
        applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
        sd->getSort()
        );
    case SpecialFunctor::TUPLE:
      return Term::createTuple(applyImpl<ProcessSpecVars>(sd->getTupleTerm(), applicator, noSharing));
    case SpecialFunctor::LAMBDA:
      // TODO in principle this should not be so difficult to handle
      ASSERTION_VIOLATION;
    case SpecialFunctor::MATCH: {
      DArray<TermList> terms(trm->arity());
      for (unsigned i = 0; i < trm->arity(); i++) {
        terms[i] = applyImpl<ProcessSpecVars>(*trm->nthArgument(i), applicator, noSharing);
      }
      return Term::createMatch(sd->getSort(), sd->getMatchedSort(), trm->arity(), terms.begin());
    }
    }
    ASSERTION_VIOLATION;
  }

  Recycled<Stack<TermList*>> toDo;
  Recycled<Stack<Term*>> terms;
  Recycled<Stack<bool>> modified;
  Recycled<Stack<TermList>> args;

  modified->push(false);
  toDo->push(trm->args());

  for(;;) {
    TermList* tt=toDo->pop();
    if(tt->isEmpty()) {
      if(terms->isEmpty()) {
        //we're done, args stack contains modified arguments
        //of the topleve term/literal.
        ASS(toDo->isEmpty());
        break;
      }
      Term* orig=terms->pop();
      if(!modified->pop()) {
        args->truncate(args->length() - orig->arity());
        args->push(TermList(orig));
        continue;
      }
      //here we assume, that stack is an array with
      //second topmost element as &top()-1, third at
      //&top()-2, etc...
      TermList* argLst=&args->top() - (orig->arity()-1);

      bool shouldShare=!noSharing && canBeShared(argLst, orig->arity());

      Term* newTrm;
      if(shouldShare) {
        if(orig->isSort()){
          newTrm=AtomicSort::create(static_cast<AtomicSort*>(orig), argLst);
        } else {
          newTrm=Term::create(orig,argLst);
        }
      }
      else {
        newTrm=Term::createNonShared(orig,argLst);
      }
      args->truncate(args->length() - orig->arity());
      args->push(TermList(newTrm));

      modified->setTop(true);
      continue;
    }
    toDo->push(tt->next());

    TermList tl=*tt;
    if(tl.isOrdinaryVar()) {
      TermList tDest=applicator.apply(tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    if(tl.isSpecialVar()) {
      TermList tDest=SpecVarHandler<ProcessSpecVars>::apply(applicator,tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    ASS(tl.isTerm());
    if(tl.isVar() || (tl.term()->shared() && tl.term()->ground())) {
      args->push(tl);
      continue;
    }
    Term* t = tl.term();
    if(t->isSpecial()) {
      //we handle specal terms at the top level of this function
      args->push(TermList(applyImpl<ProcessSpecVars>(t, applicator, noSharing)));
      continue;
    }
    terms->push(t);
    modified->push(false);
    toDo->push(t->args());
  }
  ASS(toDo->isEmpty());
  ASS(terms->isEmpty());
  ASS_EQ(modified->length(),1);
  ASS_EQ(args->length(),trm->arity());

  Term* result;
  if(!modified->pop()) {
    result=trm;
  }
  else {
    //here we assume, that stack is an array with
    //second topmost element as &top()-1, third at
    //&top()-2, etc...
    TermList* argLst=&args->top() - (trm->arity()-1);
    ASS_EQ(args->size(), trm->arity());
    if(trm->isLiteral()) {
      ASS(!noSharing);
      Literal* lit = static_cast<Literal*>(trm);
      result=Literal::create(lit,argLst);
    } else if(trm->isSort()){
      ASS(!noSharing);
      result=AtomicSort::create(static_cast<AtomicSort*>(trm),argLst);
    } else {
      bool shouldShare=!noSharing && canBeShared(argLst, trm->arity());
      if(shouldShare) {
        result=Term::create(trm,argLst);          
      } else {
        //At the memoent all sorts should be shared.
        result=Term::createNonShared(trm,argLst);
      }
    }
  }

  return result;
}